

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::ClearField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  byte bVar5;
  int iVar6;
  LogMessage *other;
  double *pdVar7;
  Message **ppMVar8;
  unsigned_long *puVar9;
  uint *puVar10;
  float *pfVar11;
  FieldDescriptor *pFVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  unsigned_long uVar18;
  long lVar19;
  LogFinisher local_69;
  double local_68;
  LogMessage local_60;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ClearField","Field does not match message type.");
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    if (this->extensions_offset_ == -1) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      other = LogMessage::operator<<(&local_60,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_69,other);
      LogMessage::~LogMessage(&local_60);
    }
    ExtensionSet::ClearExtension
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite +
               (long)this->extensions_offset_),*(int *)(field + 0x28));
    return;
  }
  if (*(int *)(field + 0x30) == 3) {
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4))
    {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      lVar15 = (long)this->offsets_
                     [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
                      -0x11111111];
      break;
    case 9:
      lVar15 = (long)this->offsets_
                     [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
                      -0x11111111];
      if (0 < *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar15)) {
        lVar19 = 0;
        do {
          puVar2 = *(undefined8 **)
                    (*(long *)((long)&(message->super_MessageLite)._vptr_MessageLite + lVar15) +
                    lVar19 * 8);
          puVar2[1] = 0;
          *(undefined1 *)*puVar2 = 0;
          lVar19 = lVar19 + 1;
        } while (lVar19 < *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar15));
      }
      break;
    case 10:
      lVar15 = (long)this->offsets_
                     [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
                      -0x11111111];
      if (0 < *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar15)) {
        lVar19 = 0;
        do {
          (**(code **)(**(long **)(*(long *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                                            lVar15) + lVar19 * 8) + 0x20))();
          lVar19 = lVar19 + 1;
        } while (lVar19 < *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar15));
      }
      *(undefined4 *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar15) = 0;
      return;
    default:
      return;
    }
    *(undefined4 *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar15) = 0;
    return;
  }
  uVar14 = (int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
           -0x11111111;
  uVar16 = uVar14 + 0x1f;
  if (-1 < (int)uVar14) {
    uVar16 = uVar14;
  }
  if ((*(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (long)((int)uVar16 >> 5) * 4 + (long)this->has_bits_offset_) >> (uVar14 & 0x1f) & 1)
      == 0) {
    return;
  }
  lVar15 = ((long)field - *(long *)(*(long *)(field + 0x38) + 0x30) >> 3) * -0x1111111111111111;
  bVar5 = (byte)lVar15 & 0x1f;
  iVar6 = (int)lVar15;
  iVar17 = iVar6 + 0x1f;
  if (-1 < iVar6) {
    iVar17 = iVar6;
  }
  puVar10 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                    (long)(iVar17 >> 5) * 4 + (long)this->has_bits_offset_);
  *puVar10 = *puVar10 & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4)) {
  case 1:
    uVar16 = *(uint *)(field + 0x70);
    goto LAB_0020cfe6;
  case 2:
    uVar18 = *(unsigned_long *)(field + 0x70);
    puVar9 = (unsigned_long *)MutableRaw<long>(this,message,field);
    goto LAB_0020d00d;
  case 3:
    uVar16 = *(uint *)(field + 0x70);
    puVar10 = MutableRaw<unsigned_int>(this,message,field);
    goto LAB_0020cff4;
  case 4:
    uVar18 = *(unsigned_long *)(field + 0x70);
    puVar9 = MutableRaw<unsigned_long>(this,message,field);
LAB_0020d00d:
    *puVar9 = uVar18;
    break;
  case 5:
    local_68 = *(double *)(field + 0x70);
    pdVar7 = MutableRaw<double>(this,message,field);
    *pdVar7 = local_68;
    break;
  case 6:
    local_68 = (double)CONCAT44(local_68._4_4_,*(undefined4 *)(field + 0x70));
    pfVar11 = MutableRaw<float>(this,message,field);
    *pfVar11 = local_68._0_4_;
    break;
  case 7:
    FVar1 = field[0x70];
    pFVar12 = (FieldDescriptor *)MutableRaw<bool>(this,message,field);
    *pFVar12 = FVar1;
    break;
  case 8:
    uVar16 = *(uint *)(*(long *)(field + 0x70) + 0x10);
LAB_0020cfe6:
    puVar10 = (uint *)MutableRaw<int>(this,message,field);
LAB_0020cff4:
    *puVar10 = uVar16;
    break;
  case 9:
    ppbVar13 = DefaultRaw<std::__cxx11::string_const*>(this,field);
    pbVar3 = *ppbVar13;
    ppbVar13 = MutableRaw<std::__cxx11::string*>(this,message,field);
    pbVar4 = *ppbVar13;
    if (pbVar4 != pbVar3) {
      if (field[0x68] == (FieldDescriptor)0x1) {
        std::__cxx11::string::_M_assign((string *)pbVar4);
        return;
      }
      pbVar4->_M_string_length = 0;
      *(pbVar4->_M_dataplus)._M_p = '\0';
    }
    break;
  case 10:
    ppMVar8 = MutableRaw<google::protobuf::Message*>(this,message,field);
    (*((*ppMVar8)->super_MessageLite)._vptr_MessageLite[4])();
    return;
  }
  return;
}

Assistant:

void GeneratedMessageReflection::ClearField(
    Message* message, const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(ClearField);

  if (field->is_extension()) {
    MutableExtensionSet(message)->ClearExtension(field->number());
  } else if (!field->is_repeated()) {
    if (HasBit(*message, field)) {
      ClearBit(message, field);

      // We need to set the field back to its default value.
      switch (field->cpp_type()) {
#define CLEAR_TYPE(CPPTYPE, TYPE)                                            \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
          *MutableRaw<TYPE>(message, field) =                                \
            field->default_value_##TYPE();                                   \
          break;

        CLEAR_TYPE(INT32 , int32 );
        CLEAR_TYPE(INT64 , int64 );
        CLEAR_TYPE(UINT32, uint32);
        CLEAR_TYPE(UINT64, uint64);
        CLEAR_TYPE(FLOAT , float );
        CLEAR_TYPE(DOUBLE, double);
        CLEAR_TYPE(BOOL  , bool  );
#undef CLEAR_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          *MutableRaw<int>(message, field) =
            field->default_value_enum()->number();
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              const string* default_ptr = DefaultRaw<const string*>(field);
              string** value = MutableRaw<string*>(message, field);
              if (*value != default_ptr) {
                if (field->has_default_value()) {
                  (*value)->assign(field->default_value_string());
                } else {
                  (*value)->clear();
                }
              }
              break;
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          (*MutableRaw<Message*>(message, field))->Clear();
          break;
      }
    }
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        MutableRaw<RepeatedField<LOWERCASE> >(message, field)->Clear();       \
        break

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING: {
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<string> >(message, field)->Clear();
            break;
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We don't know which subclass of RepeatedPtrFieldBase the type is,
        // so we use RepeatedPtrFieldBase directly.
        MutableRaw<RepeatedPtrFieldBase>(message, field)
            ->Clear<GenericTypeHandler<Message> >();
        break;
      }
    }
  }
}